

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

bool __thiscall
CorUnix::CPalSynchronizationManager::CreateProcessPipe(CPalSynchronizationManager *this)

{
  int iVar1;
  int local_1c [2];
  int rgiPipe [2];
  bool fRet;
  CPalSynchronizationManager *this_local;
  
  rgiPipe[0]._3_1_ = 1;
  local_1c[0] = -1;
  local_1c[1] = -1;
  unique0x10000077 = this;
  iVar1 = pipe(local_1c);
  if (iVar1 == -1) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    rgiPipe[0]._3_1_ = 0;
  }
  if ((rgiPipe[0]._3_1_ & 1) == 0) {
    if (local_1c[0] != -1) {
      close(local_1c[0]);
      close(local_1c[1]);
    }
  }
  else {
    this->m_iProcessPipeRead = local_1c[0];
    this->m_iProcessPipeWrite = local_1c[1];
  }
  return (bool)(rgiPipe[0]._3_1_ & 1);
}

Assistant:

bool CPalSynchronizationManager::CreateProcessPipe()
    {
        bool fRet = true;
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        int iKq = -1;
#endif // HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT

        int rgiPipe[] = { -1, -1 };
        if (pipe(rgiPipe) == -1)
        {
            ERROR("Unable to create the process pipe\n");
            fRet = false;
            goto CPP_exit;
        }

#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        iKq = kqueue();
        if (-1 == iKq)
        {
            ERROR("Failed to create kqueue associated to process pipe\n");
            fRet = false;
            goto CPP_exit;
        }
#endif // HAVE_KQUEUE

    CPP_exit:
        if (fRet)
        {
            // Succeeded
            m_iProcessPipeRead = rgiPipe[0];
            m_iProcessPipeWrite = rgiPipe[1];
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
            m_iKQueue = iKq;
#endif // HAVE_KQUEUE
        }
        else
        {
            if (-1 != rgiPipe[0])
            {
                close(rgiPipe[0]);
                close(rgiPipe[1]);
            }
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
            if (-1 != iKq)
            {
                close(iKq);
            }
#endif // HAVE_KQUEUE
        }

        return fRet;
    }